

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::pair<long,_long>_>::Resize
          (TPZVec<std::pair<long,_long>_> *this,int64_t newsize,pair<long,_long> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  pair<long,_long> *__s;
  long lVar5;
  pair<long,_long> *ppVar6;
  long lVar7;
  long lVar8;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = this->fNElements;
  if (lVar7 != newsize) {
    if (newsize == 0) {
      __s = (pair<long,_long> *)0x0;
    }
    else {
      __s = (pair<long,_long> *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize << 4)
      ;
      memset(__s,0,newsize << 4);
    }
    if (newsize <= lVar7) {
      lVar7 = newsize;
    }
    if (lVar7 < 1) {
      lVar5 = 0;
    }
    else {
      ppVar6 = this->fStore;
      lVar8 = 0;
      lVar5 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ppVar6->first + lVar8);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&__s->first + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        lVar5 = lVar5 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 != lVar5);
    }
    lVar7 = newsize - lVar5;
    if (lVar7 != 0 && lVar5 <= newsize) {
      lVar8 = object->first;
      lVar4 = object->second;
      ppVar6 = __s + lVar5;
      do {
        ppVar6->first = lVar8;
        ppVar6->second = lVar4;
        ppVar6 = ppVar6 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    if (this->fStore != (pair<long,_long> *)0x0) {
      operator_delete__(this->fStore);
      this->fStore = (pair<long,_long> *)0x0;
    }
    this->fStore = __s;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}